

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QCborMap QCborMap::fromVariantHash(QVariantHash *hash)

{
  long lVar1;
  bool bVar2;
  QCborContainerPrivate *pQVar3;
  QHash<QString,_QVariant> *in_RSI;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  long in_FS_OFFSET;
  piter pVar4;
  QCborContainerPrivate *d;
  QCborMap *m;
  const_iterator end;
  const_iterator it;
  const_iterator *in_stack_ffffffffffffff80;
  QCborContainerPrivate *in_stack_ffffffffffffff88;
  QCborMap *in_stack_ffffffffffffff90;
  QCborContainerPrivate *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QCborMap((QCborMap *)0x48c37a);
  QHash<QString,_QVariant>::size(in_RSI);
  detach(in_stack_ffffffffffffff90,(qsizetype)in_stack_ffffffffffffff88);
  pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::data
                     ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x48c39d);
  QHash<QString,_QVariant>::begin((QHash<QString,_QVariant> *)in_RDI.d.ptr);
  pVar4 = (piter)QHash<QString,_QVariant>::end
                           ((QHash<QString,_QVariant> *)in_stack_ffffffffffffff88);
  while (bVar2 = QHash<QString,_QVariant>::const_iterator::operator!=
                           ((const_iterator *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80),
        bVar2) {
    this = pQVar3;
    QHash<QString,_QVariant>::const_iterator::key((const_iterator *)0x48c423);
    QCborContainerPrivate::append(this,(QString *)in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff88 = pQVar3;
    QHash<QString,_QVariant>::const_iterator::value((const_iterator *)0x48c446);
    appendVariant((QCborContainerPrivate *)pVar4.bucket,(QVariant *)pVar4.d);
    QHash<QString,_QVariant>::const_iterator::operator++((const_iterator *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
}

Assistant:

QCborMap QCborMap::fromVariantHash(const QVariantHash &hash)
{
    QCborMap m;
    m.detach(hash.size());
    QCborContainerPrivate *d = m.d.data();

    auto it = hash.begin();
    auto end = hash.end();
    for ( ; it != end; ++it) {
        d->append(it.key());
        appendVariant(d, it.value());
    }
    return m;
}